

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O1

void __thiscall HdlcAnalyzerSettings::HdlcAnalyzerSettings(HdlcAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceInteger *pAVar3;
  AnalyzerSettingInterfaceNumberList *pAVar4;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceInteger *this_02;
  AnalyzerSettingInterfaceNumberList *pAVar5;
  ulong uVar6;
  Channel *pCVar7;
  char *pcVar8;
  uint uVar9;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdlcAnalyzerSettings_00112d68;
  this_00 = &this->mInputChannel;
  uVar6 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 2000000;
  this->mTransmissionMode = HDLC_TRANSMISSION_BIT_SYNC;
  this->mHdlcAddr = HDLC_BASIC_ADDRESS_FIELD;
  this->mHdlcControl = HDLC_BASIC_CONTROL_FIELD;
  this->mHdlcFcs = HDLC_CRC16;
  paVar1 = &this->mInputChannelInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mHdlcAddrInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcTransmissionInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcControlInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcFcsInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar2 = paVar1->_M_ptr;
  if (pAVar2 != this_01) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    paVar1->_M_ptr = this_01;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"HDLC");
  pCVar7 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  this_02 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_02);
  pAVar3 = (this->mBitRateInterface)._M_ptr;
  if (pAVar3 != this_02) {
    if (pAVar3 != (AnalyzerSettingInterfaceInteger *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))();
    }
    (this->mBitRateInterface)._M_ptr = this_02;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mBitRateInterface)._M_ptr,"Baud Rate")
  ;
  AnalyzerSettingInterfaceInteger::SetMax((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)(this->mBitRateInterface)._M_ptr);
  uVar6 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar5 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar5);
  pAVar4 = (this->mHdlcTransmissionInterface)._M_ptr;
  if (pAVar4 != pAVar5) {
    if (pAVar4 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mHdlcTransmissionInterface)._M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mHdlcTransmissionInterface)._M_ptr,"Transmission Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mHdlcTransmissionInterface)._M_ptr,"Bit Synchronous");
  pcVar8 = "Byte Asynchronous";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mHdlcTransmissionInterface)._M_ptr,"Byte Asynchronous");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTransmissionMode);
  pAVar5 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar8);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar5);
  pAVar4 = (this->mHdlcAddrInterface)._M_ptr;
  if (pAVar4 != pAVar5) {
    if (pAVar4 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mHdlcAddrInterface)._M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mHdlcAddrInterface)._M_ptr,"Address Field Type");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mHdlcAddrInterface)._M_ptr,"Basic");
  pcVar8 = "Extended";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mHdlcAddrInterface)._M_ptr,"Extended");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcAddr);
  pAVar5 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar8);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar5);
  pAVar4 = (this->mHdlcControlInterface)._M_ptr;
  if (pAVar4 != pAVar5) {
    if (pAVar4 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mHdlcControlInterface)._M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mHdlcControlInterface)._M_ptr,"Control Field Format");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mHdlcControlInterface)._M_ptr,"Basic - Modulo 8");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mHdlcControlInterface)._M_ptr,"Extended - Modulo 128");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mHdlcControlInterface)._M_ptr,"Extended - Modulo 32768");
  pcVar8 = "Extended - Modulo 2147483648";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)(this->mHdlcControlInterface)._M_ptr,"Extended - Modulo 2147483648");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcControl);
  pAVar5 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar8);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar5);
  pAVar4 = (this->mHdlcFcsInterface)._M_ptr;
  if (pAVar4 != pAVar5) {
    if (pAVar4 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mHdlcFcsInterface)._M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mHdlcFcsInterface)._M_ptr,"FCS Type");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mHdlcFcsInterface)._M_ptr,"CRC-8");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mHdlcFcsInterface)._M_ptr,"CRC-16-CCITT");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mHdlcFcsInterface)._M_ptr,"CRC-32");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcFcs);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar9 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar9,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar9,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar9,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

HdlcAnalyzerSettings::HdlcAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 2000000 ),
      mTransmissionMode( HDLC_TRANSMISSION_BIT_SYNC ),
      mHdlcAddr( HDLC_BASIC_ADDRESS_FIELD ),
      mHdlcControl( HDLC_BASIC_CONTROL_FIELD ),
      mHdlcFcs( HDLC_CRC16 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "HDLC", "Standard HDLC" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Baud Rate", "Specify the baud rate in symbols per second." );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mHdlcTransmissionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcTransmissionInterface->SetTitleAndTooltip( "Transmission Mode", "Specify the transmission mode of the HDLC frames" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BIT_SYNC, "Bit Synchronous", "Bit-oriented transmission using bit stuffing" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BYTE_ASYNC, "Byte Asynchronous",
                                           "Byte asynchronous transmission using byte stuffing (Also known as start/stop mode)" );
    mHdlcTransmissionInterface->SetNumber( mTransmissionMode );

    mHdlcAddrInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcAddrInterface->SetTitleAndTooltip( "Address Field Type", "Specify the address field type of an HDLC frame." );
    mHdlcAddrInterface->AddNumber( HDLC_BASIC_ADDRESS_FIELD, "Basic", "Basic Address Field (8 bits)" );
    mHdlcAddrInterface->AddNumber( HDLC_EXTENDED_ADDRESS_FIELD, "Extended", "Extended Address Field (8 or more bits)" );
    mHdlcAddrInterface->SetNumber( mHdlcAddr );

    mHdlcControlInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcControlInterface->SetTitleAndTooltip( "Control Field Format", "Specify the Control Field type of a HDLC frame." );
    mHdlcControlInterface->AddNumber( HDLC_BASIC_CONTROL_FIELD, "Basic - Modulo 8", "Control Field of 8 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_128, "Extended - Modulo 128", "Control Field of 16 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_32768, "Extended - Modulo 32768", "Control Field of 32 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648, "Extended - Modulo 2147483648",
                                      "Control Field of 64 bits" );
    mHdlcControlInterface->SetNumber( mHdlcControl );

    mHdlcFcsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcFcsInterface->SetTitleAndTooltip( "FCS Type", "Specify the Frame Check Sequence of an HDLC frame" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC8, "CRC-8", "8-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC16, "CRC-16-CCITT", "16-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC32, "CRC-32", "32-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->SetNumber( mHdlcFcs );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mHdlcTransmissionInterface.get() );
    AddInterface( mHdlcAddrInterface.get() );
    AddInterface( mHdlcControlInterface.get() );
    AddInterface( mHdlcFcsInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", false );
}